

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_forward_seqnum(void)

{
  fdb_encryption_key *fconfig_00;
  undefined8 uVar1;
  undefined8 uVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_doc *metalen;
  fdb_kvs_handle *handle;
  fdb_kvs_info *info_00;
  fdb_doc *pfVar8;
  fdb_doc *doc;
  fdb_config *fconfig_01;
  fdb_kvs_handle *pfVar9;
  uint uVar10;
  long lVar11;
  fdb_kvs_handle *doc_00;
  char *pcVar12;
  fdb_kvs_handle **ppfVar13;
  fdb_iterator *pfVar14;
  ulong uVar15;
  fdb_doc **ppfVar16;
  fdb_kvs_handle *pfVar17;
  fdb_kvs_handle *pfVar18;
  fdb_doc **doc_01;
  fdb_seqnum_t fVar19;
  fdb_kvs_handle *config;
  fdb_kvs_config *config_00;
  long lVar20;
  void *pvVar21;
  char *pcVar22;
  fdb_kvs_handle *kv1;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  fdb_kvs_handle *mirror_kv1;
  char setop [3];
  fdb_kvs_info info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  fdb_iterator *pfStack_1a70;
  fdb_doc *pfStack_1a68;
  fdb_kvs_handle *pfStack_1a60;
  timeval tStack_1a58;
  char acStack_1a48 [256];
  char acStack_1948 [264];
  fdb_kvs_handle *pfStack_1840;
  fdb_kvs_handle *pfStack_1838;
  fdb_kvs_handle *pfStack_1830;
  fdb_kvs_config *pfStack_1828;
  fdb_kvs_handle *pfStack_1820;
  fdb_kvs_handle *pfStack_1818;
  fdb_kvs_handle *pfStack_1808;
  fdb_custom_cmp_variable p_Stack_1800;
  fdb_kvs_handle *pfStack_17f8;
  fdb_kvs_handle *pfStack_17f0;
  fdb_kvs_handle *pfStack_17e8;
  kvs_ops_stat *pkStack_17e0;
  hbtrie *phStack_17d8;
  hbtrie *phStack_17d0;
  fdb_kvs_config fStack_17c8;
  timeval tStack_17b0;
  undefined1 auStack_17a0 [512];
  fdb_config fStack_15a0;
  fdb_kvs_handle *pfStack_14a8;
  fdb_kvs_handle *pfStack_14a0;
  fdb_kvs_handle *pfStack_1498;
  fdb_kvs_handle *pfStack_1490;
  fdb_kvs_handle *pfStack_1488;
  fdb_kvs_handle *pfStack_1480;
  undefined1 auStack_1468 [16];
  fdb_kvs_handle *pfStack_1458;
  fdb_file_handle *pfStack_1450;
  undefined1 auStack_1448 [40];
  undefined1 auStack_1420 [280];
  undefined1 auStack_1308 [336];
  timeval tStack_11b8;
  fdb_kvs_handle fStack_11a8;
  fdb_kvs_handle *pfStack_fa0;
  fdb_seqnum_t fStack_f98;
  undefined1 *puStack_f90;
  fdb_kvs_handle *pfStack_f88;
  undefined1 auStack_f78 [24];
  undefined1 auStack_f60 [64];
  fdb_kvs_config fStack_f20;
  fdb_config fStack_f08;
  char acStack_e10 [264];
  fdb_config *pfStack_d08;
  fdb_doc **ppfStack_d00;
  size_t sStack_cf8;
  fdb_doc **ppfStack_cf0;
  void *pvStack_ce8;
  fdb_doc *pfStack_ce0;
  fdb_kvs_handle *pfStack_cd0;
  fdb_file_handle *pfStack_cc8;
  fdb_kvs_handle *pfStack_cc0;
  size_t sStack_cb8;
  void *pvStack_cb0;
  fdb_kvs_info fStack_ca8;
  fdb_kvs_config fStack_c78;
  timeval tStack_c60;
  fdb_config fStack_c50;
  fdb_doc *pfStack_b58;
  fdb_kvs_handle *pfStack_b48;
  fdb_file_handle *pfStack_b40;
  int iStack_b34;
  fdb_iterator *pfStack_b30;
  fdb_doc *pfStack_b28;
  undefined1 auStack_b20 [48];
  timeval tStack_af0;
  fdb_doc *apfStack_ae0 [9];
  long lStack_a98;
  fdb_doc *apfStack_a90 [5];
  fdb_doc *apfStack_a68 [5];
  fdb_doc afStack_a40 [3];
  fdb_doc *apfStack_910 [32];
  fdb_doc afStack_810 [3];
  fdb_config fStack_710;
  fdb_kvs_info *pfStack_618;
  long lStack_610;
  fdb_kvs_handle *pfStack_608;
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  code *pcStack_5f0;
  fdb_kvs_handle *local_5e0;
  undefined1 local_5d8 [48];
  undefined8 local_5a8;
  long local_598;
  timeval local_580;
  fdb_kvs_config local_570;
  fdb_doc *apfStack_558 [101];
  fdb_config local_230;
  char local_138 [264];
  
  pcStack_5f0 = (code *)0x115ea1;
  gettimeofday(&local_580,(__timezone_ptr_t)0x0);
  pcStack_5f0 = (code *)0x115ea6;
  memleak_start();
  pcStack_5f0 = (code *)0x115eb6;
  fdb_get_default_config();
  pcStack_5f0 = (code *)0x115ec3;
  fdb_get_default_kvs_config();
  local_5d8._0_8_ = (fdb_doc *)0x0;
  pcStack_5f0 = (code *)0x115ed4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  local_230.wal_threshold = 100;
  local_230.seqtree_opt = '\x01';
  local_230.flags = 1;
  local_230.compaction_threshold = '\0';
  local_230.purging_interval = 5;
  local_230.block_reusing_threshold = 0;
  pcStack_5f0 = (code *)0x115f14;
  fdb_open((fdb_file_handle **)(local_5d8 + 8),"./mvcc_test1",&local_230);
  pcStack_5f0 = (code *)0x115f2b;
  fdb_kvs_open((fdb_file_handle *)local_5d8._8_8_,&local_5e0,"kv1",&local_570);
  pcStack_5f0 = (code *)0x115f3d;
  fdb_kvs_open((fdb_file_handle *)local_5d8._8_8_,(fdb_kvs_handle **)(local_5d8 + 0x18),(char *)0x0,
               &local_570);
  lVar11 = 0;
  uVar15 = 0;
  do {
    pcStack_5f0 = (code *)0x115f66;
    sprintf(local_138,"key%d",uVar15 & 0xffffffff);
    pcStack_5f0 = (code *)0x115f79;
    sVar5 = strlen(local_138);
    pcStack_5f0 = (code *)0x115f97;
    fdb_doc_create((fdb_doc **)((long)apfStack_558 + lVar11),local_138,sVar5,(void *)0x0,0,
                   (void *)0x0,0);
    pcStack_5f0 = (code *)0x115fa9;
    fdb_set(local_5e0,apfStack_558[uVar15]);
    uVar1 = local_5d8._24_8_;
    pcStack_5f0 = (code *)0x115fb6;
    sVar5 = strlen(local_138);
    pcStack_5f0 = (code *)0x115fcd;
    fdb_set_kv((fdb_kvs_handle *)uVar1,local_138,sVar5,local_5d8 + 0x25,3);
    uVar15 = uVar15 + 1;
    lVar11 = lVar11 + 8;
  } while (uVar15 != 0x65);
  pcStack_5f0 = (code *)0x115ff0;
  fdb_del(local_5e0,apfStack_558[100]);
  pcStack_5f0 = (code *)0x115fff;
  fdb_commit((fdb_file_handle *)local_5d8._8_8_,'\x01');
  pcStack_5f0 = (code *)0x116011;
  fdb_get_kvs_info(local_5e0,(fdb_kvs_info *)(local_5d8 + 0x28));
  uVar2 = local_5a8;
  lVar20 = 0;
  do {
    pcStack_5f0 = (code *)0x11602a;
    fdb_del(local_5e0,apfStack_558[lVar20]);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 100);
  lVar20 = 0;
  pcStack_5f0 = (code *)0x116042;
  fdb_commit((fdb_file_handle *)local_5d8._8_8_,'\0');
  info_00 = (fdb_kvs_info *)(local_5d8 + 0x28);
  pcStack_5f0 = (code *)0x116054;
  fdb_get_kvs_info(local_5e0,info_00);
  do {
    pfVar8 = apfStack_558[lVar20];
    pfVar8->deleted = false;
    pcStack_5f0 = (code *)0x11606e;
    fdb_set(local_5e0,pfVar8);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 100);
  pcStack_5f0 = (code *)0x116083;
  fdb_commit((fdb_file_handle *)local_5d8._8_8_,'\0');
  ppfVar13 = &local_5e0;
  pcStack_5f0 = (code *)0x116090;
  fVar3 = fdb_rollback(ppfVar13,(long)(int)uVar2);
  iVar4 = (int)ppfVar13;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    info_00 = (fdb_kvs_info *)(local_5d8 + 0x28);
    pcStack_5f0 = (code *)0x1160aa;
    fdb_get_kvs_info(local_5e0,info_00);
    if (local_598 != 1) {
      pcStack_5f0 = (code *)0x1160bb;
      rollback_forward_seqnum();
    }
    ppfVar13 = &local_5e0;
    pcStack_5f0 = (code *)0x1160c8;
    fVar3 = fdb_rollback(ppfVar13,(long)(int)local_5a8);
    iVar4 = (int)ppfVar13;
    if (fVar3 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0011621d;
    pcStack_5f0 = (code *)0x1160e7;
    fVar3 = fdb_iterator_sequence_init
                      ((fdb_kvs_handle *)local_5d8._24_8_,(fdb_iterator **)(local_5d8 + 0x10),0,0,0)
    ;
    iVar4 = (int)local_5d8._24_8_;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      info_00 = (fdb_kvs_info *)local_5d8;
      while( true ) {
        pcStack_5f0 = (code *)0x116101;
        pfVar14 = (fdb_iterator *)local_5d8._16_8_;
        fVar3 = fdb_iterator_get((fdb_iterator *)local_5d8._16_8_,(fdb_doc **)info_00);
        iVar4 = (int)pfVar14;
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        if (*(fdb_seqnum_t *)(local_5d8._0_8_ + 0x28) == 0x65) {
          pcStack_5f0 = (code *)0x11611f;
          pfVar17 = local_5e0;
          fVar3 = fdb_get_metaonly(local_5e0,(fdb_doc *)local_5d8._0_8_);
          iVar4 = (int)pfVar17;
          if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116213;
          if (*(bool *)(local_5d8._0_8_ + 0x48) == false) {
            pcStack_5f0 = (code *)0x11613a;
            rollback_forward_seqnum();
          }
        }
        else {
          pcStack_5f0 = (code *)0x116141;
          pfVar17 = local_5e0;
          fVar3 = fdb_get_metaonly_byseq(local_5e0,(fdb_doc *)local_5d8._0_8_);
          iVar4 = (int)pfVar17;
          if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011620e;
          if (*(bool *)(local_5d8._0_8_ + 0x48) != false) {
            pcStack_5f0 = (code *)0x116184;
            rollback_forward_seqnum();
          }
        }
        pcStack_5f0 = (code *)0x11615e;
        fdb_doc_free((fdb_doc *)local_5d8._0_8_);
        local_5d8._0_8_ = (fdb_doc *)0x0;
        pcStack_5f0 = (code *)0x116171;
        fVar3 = fdb_iterator_next((fdb_iterator *)local_5d8._16_8_);
        if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
          lVar11 = 0;
          do {
            pcStack_5f0 = (code *)0x116195;
            fdb_doc_free(apfStack_558[lVar11]);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x65);
          pcStack_5f0 = (code *)0x1161a8;
          fdb_iterator_close((fdb_iterator *)local_5d8._16_8_);
          pcStack_5f0 = (code *)0x1161b2;
          fdb_kvs_close(local_5e0);
          pcStack_5f0 = (code *)0x1161bc;
          fdb_close((fdb_file_handle *)local_5d8._8_8_);
          pcStack_5f0 = (code *)0x1161c1;
          fdb_shutdown();
          pcStack_5f0 = (code *)0x1161c6;
          memleak_end();
          pcVar12 = "%s PASSED\n";
          if (rollback_forward_seqnum()::__test_pass != '\0') {
            pcVar12 = "%s FAILED\n";
          }
          pcStack_5f0 = (code *)0x1161f7;
          fprintf(_stderr,pcVar12,"rollback forward seqnum");
          return;
        }
      }
      pcStack_5f0 = (code *)0x11620e;
      rollback_forward_seqnum();
LAB_0011620e:
      pcStack_5f0 = (code *)0x116213;
      rollback_forward_seqnum();
LAB_00116213:
      pcStack_5f0 = (code *)0x116218;
      rollback_forward_seqnum();
      goto LAB_00116218;
    }
  }
  else {
LAB_00116218:
    pcStack_5f0 = (code *)0x11621d;
    rollback_forward_seqnum();
LAB_0011621d:
    pcStack_5f0 = (code *)0x116222;
    rollback_forward_seqnum();
  }
  pcStack_5f0 = rollback_test;
  rollback_forward_seqnum();
  uStack_5f8 = local_5a8;
  uStack_600 = uVar2;
  pfStack_608 = (fdb_kvs_handle *)uVar1;
  pfStack_b58 = (fdb_doc *)0x116249;
  pfStack_618 = info_00;
  lStack_610 = lVar20;
  pcStack_5f0 = (code *)lVar11;
  gettimeofday(&tStack_af0,(__timezone_ptr_t)0x0);
  pfStack_b58 = (fdb_doc *)0x11624e;
  memleak_start();
  pfStack_b28 = (fdb_doc *)0x0;
  pfStack_b58 = (fdb_doc *)0x116262;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_b58 = (fdb_doc *)0x116272;
  fdb_get_default_config();
  pfStack_b58 = (fdb_doc *)0x11627c;
  fdb_get_default_kvs_config();
  fStack_710.buffercache_size = 0;
  fStack_710.seqtree_opt = '\x01';
  fStack_710.wal_threshold = 0x400;
  fStack_710.flags = 1;
  fStack_710.compaction_threshold = '\0';
  pfStack_b58 = (fdb_doc *)0x1162a6;
  fStack_710.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_b58 = (fdb_doc *)0x1162bd;
  fdb_open(&pfStack_b40,"./mvcc_test1",&fStack_710);
  iStack_b34 = iVar4;
  if (iVar4 == 0) {
    pfStack_b58 = (fdb_doc *)0x1162e5;
    fdb_kvs_open(pfStack_b40,&pfStack_b48,(char *)0x0,(fdb_kvs_config *)(auStack_b20 + 0x18));
  }
  else {
    pfStack_b58 = (fdb_doc *)0x1162d7;
    fdb_kvs_open_default(pfStack_b40,&pfStack_b48,(fdb_kvs_config *)(auStack_b20 + 0x18));
  }
  lVar11 = 0;
  uVar15 = 0;
  do {
    pfStack_b58 = (fdb_doc *)0x116307;
    sprintf((char *)&afStack_a40[0].offset,"key%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x116323;
    sprintf((char *)afStack_810,"meta%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x11633f;
    sprintf((char *)apfStack_910,"body%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x11634f;
    sVar5 = strlen((char *)&afStack_a40[0].offset);
    pfStack_b58 = (fdb_doc *)0x11635a;
    sVar6 = strlen((char *)afStack_810);
    pfStack_b58 = (fdb_doc *)0x116365;
    sVar7 = strlen((char *)apfStack_910);
    pfStack_b58 = (fdb_doc *)0x11638a;
    fdb_doc_create((fdb_doc **)((long)apfStack_ae0 + lVar11),&afStack_a40[0].offset,sVar5,
                   afStack_810,sVar6,apfStack_910,sVar7);
    pfStack_b58 = (fdb_doc *)0x116399;
    fdb_set(pfStack_b48,apfStack_ae0[uVar15]);
    uVar15 = uVar15 + 1;
    lVar11 = lVar11 + 8;
  } while (uVar15 != 5);
  pfStack_b58 = (fdb_doc *)0x1163b9;
  fdb_commit(pfStack_b40,'\x01');
  uVar15 = 5;
  ppfVar16 = apfStack_ae0 + 5;
  do {
    pfStack_b58 = (fdb_doc *)0x1163e3;
    sprintf((char *)&afStack_a40[0].offset,"key%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x1163ff;
    sprintf((char *)afStack_810,"meta%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x11641b;
    sprintf((char *)apfStack_910,"body%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x116423;
    sVar5 = strlen((char *)&afStack_a40[0].offset);
    pfStack_b58 = (fdb_doc *)0x11642e;
    sVar6 = strlen((char *)afStack_810);
    pfStack_b58 = (fdb_doc *)0x116439;
    sVar7 = strlen((char *)apfStack_910);
    pfStack_b58 = (fdb_doc *)0x116459;
    fdb_doc_create(ppfVar16,&afStack_a40[0].offset,sVar5,afStack_810,sVar6,apfStack_910,sVar7);
    pfStack_b58 = (fdb_doc *)0x116466;
    fdb_set(pfStack_b48,*ppfVar16);
    uVar15 = uVar15 + 1;
    ppfVar16 = ppfVar16 + 1;
  } while (uVar15 != 10);
  pfStack_b58 = (fdb_doc *)0x116483;
  fdb_commit(pfStack_b40,'\0');
  ppfVar16 = apfStack_a90;
  auStack_b20._16_8_ = *(undefined8 *)(lStack_a98 + 0x28);
  uVar15 = 10;
  do {
    pfStack_b58 = (fdb_doc *)0x1164ba;
    sprintf((char *)&afStack_a40[0].offset,"key%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x1164d6;
    sprintf((char *)afStack_810,"meta%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x1164f2;
    sprintf((char *)apfStack_910,"body%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x1164fa;
    sVar5 = strlen((char *)&afStack_a40[0].offset);
    pfStack_b58 = (fdb_doc *)0x116505;
    sVar6 = strlen((char *)afStack_810);
    pfStack_b58 = (fdb_doc *)0x116510;
    sVar7 = strlen((char *)apfStack_910);
    pfStack_b58 = (fdb_doc *)0x116530;
    fdb_doc_create(ppfVar16,&afStack_a40[0].offset,sVar5,afStack_810,sVar6,apfStack_910,sVar7);
    pfStack_b58 = (fdb_doc *)0x11653d;
    fdb_set(pfStack_b48,*ppfVar16);
    uVar15 = uVar15 + 1;
    ppfVar16 = ppfVar16 + 1;
  } while (uVar15 != 0xf);
  pfStack_b58 = (fdb_doc *)0x11655d;
  fdb_commit(pfStack_b40,'\x01');
  uVar15 = 0xf;
  ppfVar16 = apfStack_a68;
  do {
    pfStack_b58 = (fdb_doc *)0x116587;
    sprintf((char *)&afStack_a40[0].offset,"key%d",uVar15 & 0xffffffff);
    pfVar8 = afStack_810;
    pfStack_b58 = (fdb_doc *)0x1165a3;
    sprintf((char *)pfVar8,"meta%d",uVar15 & 0xffffffff);
    doc_01 = apfStack_910;
    pfStack_b58 = (fdb_doc *)0x1165bf;
    sprintf((char *)doc_01,"body%d",uVar15 & 0xffffffff);
    pfStack_b58 = (fdb_doc *)0x1165c7;
    sVar5 = strlen((char *)&afStack_a40[0].offset);
    pfStack_b58 = (fdb_doc *)0x1165d2;
    metalen = (fdb_doc *)strlen((char *)pfVar8);
    pfStack_b58 = (fdb_doc *)0x1165dd;
    sVar6 = strlen((char *)doc_01);
    pfStack_b58 = (fdb_doc *)0x1165fd;
    fdb_doc_create(ppfVar16,&afStack_a40[0].offset,sVar5,pfVar8,(size_t)metalen,doc_01,sVar6);
    pfStack_b58 = (fdb_doc *)0x11660b;
    fdb_set(pfStack_b48,*ppfVar16);
    uVar15 = uVar15 + 1;
    ppfVar16 = ppfVar16 + 1;
  } while (uVar15 != 0x14);
  pfStack_b58 = (fdb_doc *)0x116628;
  fdb_commit(pfStack_b40,'\0');
  pfStack_b58 = (fdb_doc *)0x116640;
  fVar3 = fdb_set_log_callback(pfStack_b48,logCallbackFunc,"rollback_test");
  pvVar21 = (void *)0x14;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_b58 = (fdb_doc *)0x116657;
    fVar3 = fdb_rollback(&pfStack_b48,999999);
    doc = pfVar8;
    if (fVar3 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001168f9;
    doc = (fdb_doc *)auStack_b20;
    pfStack_b58 = (fdb_doc *)0x11667c;
    fdb_open((fdb_file_handle **)doc,"./mvcc_test1",&fStack_710);
    doc_01 = (fdb_doc **)auStack_b20._16_8_;
    if ((char)iStack_b34 == '\0') {
      pfStack_b58 = (fdb_doc *)0x1166a8;
      fdb_kvs_open((fdb_file_handle *)auStack_b20._0_8_,(fdb_kvs_handle **)(auStack_b20 + 8),
                   (char *)0x0,(fdb_kvs_config *)(auStack_b20 + 0x18));
    }
    else {
      pfStack_b58 = (fdb_doc *)0x11669a;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_b20._0_8_,(fdb_kvs_handle **)(auStack_b20 + 8),
                 (fdb_kvs_config *)(auStack_b20 + 0x18));
    }
    pfStack_b58 = (fdb_doc *)0x1166b7;
    fdb_begin_transaction((fdb_file_handle *)auStack_b20._0_8_,'\x02');
    pfStack_b58 = (fdb_doc *)0x1166c4;
    fVar3 = fdb_rollback(&pfStack_b48,(fdb_seqnum_t)doc_01);
    if (fVar3 != FDB_RESULT_FAIL_BY_TRANSACTION) goto LAB_001168fe;
    pfStack_b58 = (fdb_doc *)0x1166d7;
    fdb_abort_transaction((fdb_file_handle *)auStack_b20._0_8_);
    pfStack_b58 = (fdb_doc *)0x1166e1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_b20._8_8_);
    pfStack_b58 = (fdb_doc *)0x1166eb;
    fdb_close((fdb_file_handle *)auStack_b20._0_8_);
    pfStack_b58 = (fdb_doc *)0x1166f8;
    fVar3 = fdb_rollback(&pfStack_b48,(fdb_seqnum_t)doc_01);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116903;
    pfStack_b58 = (fdb_doc *)0x116715;
    fdb_get_kvs_info(pfStack_b48,(fdb_kvs_info *)afStack_a40);
    if ((fdb_doc **)afStack_a40[0].metalen != doc_01) {
      pfStack_b58 = (fdb_doc *)0x11672b;
      rollback_test();
    }
    *(undefined1 *)apfStack_a90[0]->body = 0x42;
    pfStack_b58 = (fdb_doc *)0x11674c;
    fdb_set(pfStack_b48,apfStack_a90[0]);
    sVar5 = 0;
    pfStack_b58 = (fdb_doc *)0x11675b;
    fdb_commit(pfStack_b40,'\0');
    pfStack_b58 = (fdb_doc *)0x116771;
    fdb_iterator_sequence_init(pfStack_b48,&pfStack_b30,0,0,0);
    doc_01 = &pfStack_b28;
    pfVar8 = afStack_a40;
    do {
      pfStack_b58 = (fdb_doc *)0x116783;
      fVar3 = fdb_iterator_get(pfStack_b30,doc_01);
      doc = pfStack_b28;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_001168d9:
        pfStack_b58 = (fdb_doc *)0x1168de;
        rollback_test();
LAB_001168de:
        pfStack_b58 = (fdb_doc *)0x1168e9;
        rollback_test();
LAB_001168e9:
        pfStack_b58 = (fdb_doc *)0x1168f4;
        rollback_test();
        goto LAB_001168f4;
      }
      pvVar21 = pfStack_b28->key;
      metalen = apfStack_ae0[sVar5];
      ppfVar16 = (fdb_doc **)metalen->key;
      pfStack_b58 = (fdb_doc *)0x1167ab;
      iVar4 = bcmp(pvVar21,ppfVar16,pfStack_b28->keylen);
      pfVar8 = doc;
      if (iVar4 != 0) {
        pfStack_b58 = (fdb_doc *)0x1168d9;
        rollback_test();
        goto LAB_001168d9;
      }
      pvVar21 = doc->meta;
      ppfVar16 = (fdb_doc **)metalen->meta;
      pfStack_b58 = (fdb_doc *)0x1167ca;
      iVar4 = bcmp(pvVar21,ppfVar16,doc->metalen);
      if (iVar4 != 0) goto LAB_001168e9;
      pvVar21 = doc->body;
      ppfVar16 = (fdb_doc **)metalen->body;
      pfStack_b58 = (fdb_doc *)0x1167e9;
      iVar4 = bcmp(pvVar21,ppfVar16,doc->bodylen);
      if (iVar4 != 0) goto LAB_001168de;
      pfStack_b58 = (fdb_doc *)0x1167f9;
      fdb_doc_free(doc);
      pfStack_b28 = (fdb_doc *)0x0;
      sVar5 = sVar5 + 1;
      pfStack_b58 = (fdb_doc *)0x11680f;
      fVar3 = fdb_iterator_next(pfStack_b30);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)sVar5 == 0xb) {
      pfStack_b58 = (fdb_doc *)0x11682c;
      fdb_iterator_close(pfStack_b30);
      pfStack_b58 = (fdb_doc *)0x116836;
      fdb_kvs_close(pfStack_b48);
      pfStack_b58 = (fdb_doc *)0x116840;
      fdb_close(pfStack_b40);
      lVar11 = 0;
      do {
        pfStack_b58 = (fdb_doc *)0x11684c;
        fdb_doc_free(apfStack_ae0[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x14);
      pfStack_b58 = (fdb_doc *)0x11685a;
      fdb_shutdown();
      pfStack_b58 = (fdb_doc *)0x11685f;
      memleak_end();
      pcVar12 = "single kv mode:";
      if ((char)iStack_b34 != '\0') {
        pcVar12 = "multiple kv mode:";
      }
      pfStack_b58 = (fdb_doc *)0x11688f;
      sprintf((char *)apfStack_910,"rollback test %s",pcVar12);
      pcVar12 = "%s PASSED\n";
      if (rollback_test(bool)::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_b58 = (fdb_doc *)0x1168bc;
      fprintf(_stderr,pcVar12,apfStack_910);
      return;
    }
  }
  else {
LAB_001168f4:
    pfStack_b58 = (fdb_doc *)0x1168f9;
    rollback_test();
    doc = pfVar8;
LAB_001168f9:
    pfStack_b58 = (fdb_doc *)0x1168fe;
    rollback_test();
LAB_001168fe:
    pfStack_b58 = (fdb_doc *)0x116903;
    rollback_test();
LAB_00116903:
    pfStack_b58 = (fdb_doc *)0x116908;
    rollback_test();
  }
  pfStack_b58 = (fdb_doc *)rollback_and_snapshot_test;
  rollback_test();
  pfStack_ce0 = (fdb_doc *)0x116921;
  pfStack_b58 = doc;
  gettimeofday(&tStack_c60,(__timezone_ptr_t)0x0);
  pfStack_ce0 = (fdb_doc *)0x116926;
  memleak_start();
  pfStack_ce0 = (fdb_doc *)0x116932;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_01 = &fStack_c50;
  pfStack_ce0 = (fdb_doc *)0x116942;
  fdb_get_default_config();
  pfStack_ce0 = (fdb_doc *)0x11694c;
  fdb_get_default_kvs_config();
  pfStack_ce0 = (fdb_doc *)0x116960;
  fVar3 = fdb_open(&pfStack_cc8,"mvcc_test",fconfig_01);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_ce0 = (fdb_doc *)0x11697e;
    fVar3 = fdb_kvs_open(pfStack_cc8,&pfStack_cd0,(char *)0x0,&fStack_c78);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b87;
    pfStack_ce0 = (fdb_doc *)0x1169a9;
    fVar3 = fdb_set_kv(pfStack_cd0,"a",1,"val-a",5);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b8c;
    pfStack_ce0 = (fdb_doc *)0x1169bd;
    fVar3 = fdb_commit(pfStack_cc8,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b91;
    pfStack_ce0 = (fdb_doc *)0x1169d4;
    fVar3 = fdb_get_kvs_info(pfStack_cd0,&fStack_ca8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b96;
    pfStack_ce0 = (fdb_doc *)0x1169ff;
    fVar3 = fdb_set_kv(pfStack_cd0,"b",1,"val-b",5);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b9b;
    pfStack_ce0 = (fdb_doc *)0x116a13;
    fVar3 = fdb_commit(pfStack_cc8,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116ba0;
    pfStack_ce0 = (fdb_doc *)0x116a2a;
    fVar3 = fdb_get_kvs_info(pfStack_cd0,&fStack_ca8);
    fVar19 = fStack_ca8.last_seqnum;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116ba5;
    pfStack_ce0 = (fdb_doc *)0x116a5a;
    fVar3 = fdb_set_kv(pfStack_cd0,"c",1,"val-c",5);
    fconfig_01 = (fdb_config *)fVar19;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116baa;
    pfStack_ce0 = (fdb_doc *)0x116a6e;
    fVar3 = fdb_commit(pfStack_cc8,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116baf;
    pfStack_ce0 = (fdb_doc *)0x116a85;
    fVar3 = fdb_get_kvs_info(pfStack_cd0,&fStack_ca8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116bb4;
    pfStack_ce0 = (fdb_doc *)0x116a9a;
    fVar3 = fdb_rollback(&pfStack_cd0,fVar19);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116bb9;
    pfStack_ce0 = (fdb_doc *)0x116ab1;
    fVar3 = fdb_get_kvs_info(pfStack_cd0,&fStack_ca8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116bbe;
    pfStack_ce0 = (fdb_doc *)0x116ade;
    fVar3 = fdb_get_kv(pfStack_cd0,"c",1,&pvStack_cb0,&sStack_cb8);
    fconfig_01 = (fdb_config *)fStack_ca8.last_seqnum;
    if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116bc3;
    pfStack_ce0 = (fdb_doc *)0x116af9;
    fVar3 = fdb_snapshot_open(pfStack_cd0,&pfStack_cc0,fStack_ca8.last_seqnum);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116bc8;
    pfStack_ce0 = (fdb_doc *)0x116b21;
    fVar3 = fdb_get_kv(pfStack_cc0,"c",1,&pvStack_cb0,&sStack_cb8);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pfStack_ce0 = (fdb_doc *)0x116b34;
      fdb_kvs_close(pfStack_cc0);
      pfStack_ce0 = (fdb_doc *)0x116b3e;
      fdb_close(pfStack_cc8);
      pfStack_ce0 = (fdb_doc *)0x116b43;
      fdb_shutdown();
      pfStack_ce0 = (fdb_doc *)0x116b48;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (rollback_and_snapshot_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_ce0 = (fdb_doc *)0x116b79;
      fprintf(_stderr,pcVar12,"rollback and snapshot test");
      return;
    }
  }
  else {
    pfStack_ce0 = (fdb_doc *)0x116b87;
    rollback_and_snapshot_test();
LAB_00116b87:
    pfStack_ce0 = (fdb_doc *)0x116b8c;
    rollback_and_snapshot_test();
LAB_00116b8c:
    pfStack_ce0 = (fdb_doc *)0x116b91;
    rollback_and_snapshot_test();
LAB_00116b91:
    pfStack_ce0 = (fdb_doc *)0x116b96;
    rollback_and_snapshot_test();
LAB_00116b96:
    pfStack_ce0 = (fdb_doc *)0x116b9b;
    rollback_and_snapshot_test();
LAB_00116b9b:
    pfStack_ce0 = (fdb_doc *)0x116ba0;
    rollback_and_snapshot_test();
LAB_00116ba0:
    pfStack_ce0 = (fdb_doc *)0x116ba5;
    rollback_and_snapshot_test();
LAB_00116ba5:
    pfStack_ce0 = (fdb_doc *)0x116baa;
    rollback_and_snapshot_test();
LAB_00116baa:
    pfStack_ce0 = (fdb_doc *)0x116baf;
    rollback_and_snapshot_test();
LAB_00116baf:
    pfStack_ce0 = (fdb_doc *)0x116bb4;
    rollback_and_snapshot_test();
LAB_00116bb4:
    pfStack_ce0 = (fdb_doc *)0x116bb9;
    rollback_and_snapshot_test();
LAB_00116bb9:
    pfStack_ce0 = (fdb_doc *)0x116bbe;
    rollback_and_snapshot_test();
LAB_00116bbe:
    pfStack_ce0 = (fdb_doc *)0x116bc3;
    rollback_and_snapshot_test();
LAB_00116bc3:
    pfStack_ce0 = (fdb_doc *)0x116bc8;
    rollback_and_snapshot_test();
LAB_00116bc8:
    pfStack_ce0 = (fdb_doc *)0x116bcd;
    rollback_and_snapshot_test();
  }
  pfStack_ce0 = (fdb_doc *)rollback_ncommits;
  rollback_and_snapshot_test();
  pfStack_f88 = (fdb_kvs_handle *)0x116bef;
  pfStack_d08 = fconfig_01;
  ppfStack_d00 = ppfVar16;
  sStack_cf8 = sVar5;
  ppfStack_cf0 = doc_01;
  pvStack_ce8 = pvVar21;
  pfStack_ce0 = metalen;
  gettimeofday((timeval *)(auStack_f60 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_f88 = (fdb_kvs_handle *)0x116bf4;
  memleak_start();
  pfStack_f88 = (fdb_kvs_handle *)0x116c01;
  fdb_get_default_config();
  pfStack_f88 = (fdb_kvs_handle *)0x116c0e;
  fdb_get_default_kvs_config();
  pfStack_f88 = (fdb_kvs_handle *)0x116c1a;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fStack_f08.wal_threshold = 0x400;
  fStack_f08.flags = 1;
  fStack_f08.compaction_threshold = '\0';
  fStack_f08.block_reusing_threshold = 0;
  pfStack_f88 = (fdb_kvs_handle *)0x116c51;
  fdb_open((fdb_file_handle **)(auStack_f78 + 8),"./mvcc_test1",&fStack_f08);
  pfStack_f88 = (fdb_kvs_handle *)0x116c68;
  fdb_kvs_open((fdb_file_handle *)auStack_f78._8_8_,(fdb_kvs_handle **)auStack_f78,"kv1",&fStack_f20
              );
  pfStack_f88 = (fdb_kvs_handle *)0x116c7a;
  fdb_kvs_open((fdb_file_handle *)auStack_f78._8_8_,(fdb_kvs_handle **)(auStack_f78 + 0x10),
               (char *)0x0,&fStack_f20);
  uVar15 = 0;
  do {
    iVar4 = 0;
    do {
      pfStack_f88 = (fdb_kvs_handle *)0x116ca3;
      sprintf(acStack_e10,"key%02d%03d",uVar15);
      uVar1 = auStack_f78._0_8_;
      pfStack_f88 = (fdb_kvs_handle *)0x116cb0;
      sVar5 = strlen(acStack_e10);
      pfStack_f88 = (fdb_kvs_handle *)0x116cc3;
      fdb_set_kv((fdb_kvs_handle *)uVar1,acStack_e10,sVar5,(void *)0x0,0);
      uVar1 = auStack_f78._16_8_;
      pfStack_f88 = (fdb_kvs_handle *)0x116cd0;
      sVar5 = strlen(acStack_e10);
      pfStack_f88 = (fdb_kvs_handle *)0x116ce3;
      fdb_set_kv((fdb_kvs_handle *)uVar1,acStack_e10,sVar5,(void *)0x0,0);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 100);
    pfStack_f88 = (fdb_kvs_handle *)0x116cf9;
    fdb_commit((fdb_file_handle *)auStack_f78._8_8_,(byte)uVar15 & 1);
    pfStack_f88 = (fdb_kvs_handle *)0x116d06;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_f78._0_8_,(fdb_kvs_info *)auStack_f60);
    if (auStack_f60._16_8_ != auStack_f60._8_8_) {
      pfStack_f88 = (fdb_kvs_handle *)0x116d2e;
      rollback_ncommits();
    }
    uVar10 = (int)uVar15 + 1;
    uVar15 = (ulong)uVar10;
  } while (uVar10 != 10);
  doc_00 = (fdb_kvs_handle *)0xb;
  fVar19 = 1000;
  pfVar17 = (fdb_kvs_handle *)auStack_f78;
  pfVar18 = (fdb_kvs_handle *)auStack_f60;
  while( true ) {
    pfStack_f88 = (fdb_kvs_handle *)0x116d5a;
    fVar3 = fdb_rollback((fdb_kvs_handle **)pfVar17,fVar19);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfStack_f88 = (fdb_kvs_handle *)0x116d6f;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_f78._0_8_,(fdb_kvs_info *)pfVar18);
    if (auStack_f60._16_8_ != auStack_f60._8_8_) {
      pfStack_f88 = (fdb_kvs_handle *)0x116d95;
      rollback_ncommits();
    }
    doc_00 = (fdb_kvs_handle *)((long)&doc_00[-1].bub_ctx.handle + 7);
    fVar19 = fVar19 - 100;
    if (doc_00 < (fdb_kvs_handle *)0x2) {
      pfStack_f88 = (fdb_kvs_handle *)0x116da1;
      fdb_kvs_close((fdb_kvs_handle *)auStack_f78._0_8_);
      pfStack_f88 = (fdb_kvs_handle *)0x116dab;
      fdb_close((fdb_file_handle *)auStack_f78._8_8_);
      pfStack_f88 = (fdb_kvs_handle *)0x116db0;
      fdb_shutdown();
      pfStack_f88 = (fdb_kvs_handle *)0x116db5;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (rollback_ncommits()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_f88 = (fdb_kvs_handle *)0x116de6;
      fprintf(_stderr,pcVar12,"rollback n commits");
      return;
    }
  }
  pfStack_f88 = (fdb_kvs_handle *)transaction_test;
  rollback_ncommits();
  pfStack_1480 = (fdb_kvs_handle *)0x116e1d;
  fStack_11a8.bub_ctx.space_used = (uint64_t)(auStack_f60 + 0x10);
  fStack_11a8.bub_ctx.handle = pfVar17;
  pfStack_fa0 = pfVar18;
  fStack_f98 = fVar19;
  puStack_f90 = auStack_f60 + 8;
  pfStack_f88 = doc_00;
  gettimeofday(&tStack_11b8,(__timezone_ptr_t)0x0);
  pfStack_1480 = (fdb_kvs_handle *)0x116e22;
  memleak_start();
  pfStack_1480 = (fdb_kvs_handle *)0x116e2e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1480 = (fdb_kvs_handle *)0x116e3e;
  fdb_get_default_config();
  config = (fdb_kvs_handle *)auStack_1420;
  pfStack_1480 = (fdb_kvs_handle *)0x116e4b;
  fdb_get_default_kvs_config();
  fStack_11a8.config.encryption_key.bytes[4] = '\0';
  fStack_11a8.config.encryption_key.bytes[5] = '\0';
  fStack_11a8.config.encryption_key.bytes[6] = '\0';
  fStack_11a8.config.encryption_key.bytes[7] = '\0';
  fStack_11a8.config.encryption_key.bytes[8] = '\0';
  fStack_11a8.config.encryption_key.bytes[9] = '\0';
  fStack_11a8.config.encryption_key.bytes[10] = '\0';
  fStack_11a8.config.encryption_key.bytes[0xb] = '\0';
  fStack_11a8.config.encryption_key.bytes[0xc] = '\0';
  fStack_11a8.config.encryption_key.bytes[0xd] = '\x04';
  fStack_11a8.config.encryption_key.bytes[0xe] = '\0';
  fStack_11a8.config.encryption_key.bytes[0xf] = '\0';
  fStack_11a8.config.encryption_key.bytes[0x10] = '\0';
  fStack_11a8.config.encryption_key.bytes[0x11] = '\0';
  fStack_11a8.config.encryption_key.bytes[0x12] = '\0';
  fStack_11a8.config.encryption_key.bytes[0x13] = '\0';
  fStack_11a8.config._180_4_ = 1;
  fStack_11a8.config.encryption_key.bytes[0x18] = '\0';
  fStack_11a8.config.encryption_key.bytes[0x19] = '\0';
  fStack_11a8.config.encryption_key.bytes[0x1a] = '\0';
  fStack_11a8.config.encryption_key.bytes[0x1b] = '\0';
  fStack_11a8.config.block_reusing_threshold._7_1_ = 0;
  pfVar9 = (fdb_kvs_handle *)auStack_1448;
  pfStack_1480 = (fdb_kvs_handle *)0x116e84;
  fdb_open((fdb_file_handle **)pfVar9,"mvcc_test1",(fdb_config *)&fStack_11a8.config.encryption_key)
  ;
  pcVar12 = auStack_1468 + 8;
  pfStack_1480 = (fdb_kvs_handle *)0x116e97;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1448._0_8_,(fdb_kvs_handle **)pcVar12,
             (fdb_kvs_config *)config);
  pfStack_1480 = (fdb_kvs_handle *)0x116ead;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1468._8_8_,logCallbackFunc,"transaction_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e41;
  fconfig_00 = &fStack_11a8.config.encryption_key;
  pfStack_1480 = (fdb_kvs_handle *)0x116ed7;
  fdb_open(&pfStack_1450,"mvcc_test1",(fdb_config *)fconfig_00);
  pfStack_1480 = (fdb_kvs_handle *)0x116eea;
  fdb_open((fdb_file_handle **)(auStack_1448 + 0x10),"mvcc_test1",(fdb_config *)fconfig_00);
  pfStack_1480 = (fdb_kvs_handle *)0x116eff;
  fdb_kvs_open_default(pfStack_1450,&pfStack_1458,(fdb_kvs_config *)auStack_1420);
  pfStack_1480 = (fdb_kvs_handle *)0x116f10;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1448._16_8_,(fdb_kvs_handle **)(auStack_1448 + 8),
             (fdb_kvs_config *)auStack_1420);
  pfStack_1480 = (fdb_kvs_handle *)0x116f1d;
  fdb_begin_transaction(pfStack_1450,'\x02');
  pfStack_1480 = (fdb_kvs_handle *)0x116f2b;
  fdb_begin_transaction((fdb_file_handle *)auStack_1448._16_8_,'\x02');
  lVar11 = 0;
  uVar15 = 0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x116f4b;
    sprintf(auStack_1308 + 0x50,"key%d",uVar15 & 0xffffffff);
    pfStack_1480 = (fdb_kvs_handle *)0x116f63;
    sprintf((char *)&fStack_11a8,"meta%d",uVar15 & 0xffffffff);
    pfStack_1480 = (fdb_kvs_handle *)0x116f78;
    sprintf(auStack_1420 + 0x18,"body%d",uVar15 & 0xffffffff);
    pfStack_1480 = (fdb_kvs_handle *)0x116f8b;
    sVar5 = strlen(auStack_1308 + 0x50);
    pfStack_1480 = (fdb_kvs_handle *)0x116f9e;
    sVar6 = strlen((char *)&fStack_11a8);
    pfStack_1480 = (fdb_kvs_handle *)0x116fab;
    sVar7 = strlen(auStack_1420 + 0x18);
    pfStack_1480 = (fdb_kvs_handle *)0x116fcd;
    fdb_doc_create((fdb_doc **)(auStack_1308 + lVar11),auStack_1308 + 0x50,sVar5,&fStack_11a8,sVar6,
                   auStack_1420 + 0x18,sVar7);
    pfStack_1480 = (fdb_kvs_handle *)0x116fdf;
    fdb_set(pfStack_1458,*(fdb_doc **)(auStack_1308 + uVar15 * 8));
    uVar15 = uVar15 + 1;
    lVar11 = lVar11 + 8;
  } while (uVar15 != 5);
  uVar15 = 5;
  pfVar18 = (fdb_kvs_handle *)0x28;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x117016;
    sprintf(auStack_1308 + 0x50,"key%d",uVar15 & 0xffffffff);
    pfStack_1480 = (fdb_kvs_handle *)0x11702e;
    sprintf((char *)&fStack_11a8,"meta%d",uVar15 & 0xffffffff);
    pfStack_1480 = (fdb_kvs_handle *)0x117043;
    sprintf(auStack_1420 + 0x18,"body%d",uVar15 & 0xffffffff);
    pfVar17 = (fdb_kvs_handle *)(auStack_1308 + (long)pfVar18);
    pfStack_1480 = (fdb_kvs_handle *)0x117056;
    sVar5 = strlen(auStack_1308 + 0x50);
    pfStack_1480 = (fdb_kvs_handle *)0x117069;
    sVar6 = strlen((char *)&fStack_11a8);
    pfStack_1480 = (fdb_kvs_handle *)0x117076;
    sVar7 = strlen(auStack_1420 + 0x18);
    pfStack_1480 = (fdb_kvs_handle *)0x117098;
    fdb_doc_create((fdb_doc **)pfVar17,auStack_1308 + 0x50,sVar5,&fStack_11a8,sVar6,
                   auStack_1420 + 0x18,sVar7);
    pfStack_1480 = (fdb_kvs_handle *)0x1170aa;
    fdb_set((fdb_kvs_handle *)auStack_1448._8_8_,*(fdb_doc **)(auStack_1308 + uVar15 * 8));
    uVar15 = uVar15 + 1;
    pfVar18 = (fdb_kvs_handle *)((long)pfVar18 + 8);
  } while (uVar15 != 10);
  pcVar12 = "key%d";
  config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_1468;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x1170e0;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_1480 = (fdb_kvs_handle *)0x1170e8;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x117106;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x117115;
    fVar3 = fdb_get(pfStack_1458,(fdb_doc *)auStack_1468._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e23;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00117e28;
    pfStack_1480 = (fdb_kvs_handle *)0x117135;
    fdb_doc_free((fdb_doc *)auStack_1468._0_8_);
    uVar10 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_1480 = (fdb_kvs_handle *)0x117158;
  fdb_open((fdb_file_handle **)(auStack_1448 + 0x18),"mvcc_test1",
           (fdb_config *)&fStack_11a8.config.encryption_key);
  pfStack_1480 = (fdb_kvs_handle *)0x11716a;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1448._24_8_,(fdb_kvs_handle **)(auStack_1448 + 0x20),
             (fdb_kvs_config *)auStack_1420);
  pfStack_1480 = (fdb_kvs_handle *)0x117177;
  fdb_begin_transaction((fdb_file_handle *)auStack_1448._24_8_,'\x03');
  pcVar12 = auStack_1308 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x11719c;
    sprintf(pcVar12,"key%d",doc_00);
    pfStack_1480 = (fdb_kvs_handle *)0x1171a4;
    sVar5 = strlen(pcVar12);
    pfStack_1480 = (fdb_kvs_handle *)0x1171c2;
    fdb_doc_create((fdb_doc **)auStack_1468,pcVar12,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x1171d1;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1448._32_8_,(fdb_doc *)auStack_1468._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pfStack_1480 = (fdb_kvs_handle *)0x117d8b;
      transaction_test();
      goto LAB_00117d8b;
    }
    pfStack_1480 = (fdb_kvs_handle *)0x1171e3;
    fdb_doc_free((fdb_doc *)auStack_1468._0_8_);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_1480 = (fdb_kvs_handle *)0x1171f6;
  fdb_end_transaction((fdb_file_handle *)auStack_1448._24_8_,'\0');
  pfStack_1480 = (fdb_kvs_handle *)0x117200;
  fdb_close((fdb_file_handle *)auStack_1448._24_8_);
  pfStack_1480 = (fdb_kvs_handle *)0x11720c;
  fdb_end_transaction(pfStack_1450,'\0');
  pcVar12 = "key%d";
  config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_1468;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x117231;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_1480 = (fdb_kvs_handle *)0x117239;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x117257;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x117266;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1468._8_8_,(fdb_doc *)auStack_1468._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e2d;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00117e32;
    pfStack_1480 = (fdb_kvs_handle *)0x117286;
    fdb_doc_free((fdb_doc *)auStack_1468._0_8_);
    uVar10 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_1468;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x1172b2;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_1480 = (fdb_kvs_handle *)0x1172ba;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x1172d8;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x1172e7;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1448._8_8_,(fdb_doc *)auStack_1468._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117d8b;
    pfStack_1480 = (fdb_kvs_handle *)0x1172f9;
    fdb_doc_free((fdb_doc *)auStack_1468._0_8_);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_1480 = (fdb_kvs_handle *)0x11730a;
  fdb_abort_transaction((fdb_file_handle *)auStack_1448._16_8_);
  pfStack_1480 = (fdb_kvs_handle *)0x117317;
  fdb_close((fdb_file_handle *)auStack_1448._0_8_);
  pfStack_1480 = (fdb_kvs_handle *)0x11732e;
  fdb_open((fdb_file_handle **)auStack_1448,"mvcc_test1",
           (fdb_config *)&fStack_11a8.config.encryption_key);
  pcVar12 = auStack_1468 + 8;
  pfStack_1480 = (fdb_kvs_handle *)0x117343;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1448._0_8_,(fdb_kvs_handle **)pcVar12,
             (fdb_kvs_config *)auStack_1420);
  pfStack_1480 = (fdb_kvs_handle *)0x117359;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1468._8_8_,logCallbackFunc,"transaction_test");
  pcVar22 = (char *)pfVar17;
  handle = pfVar18;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e46;
  pcVar12 = "key%d";
  config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_1468;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x117386;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_1480 = (fdb_kvs_handle *)0x11738e;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x1173ac;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x1173bb;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1468._8_8_,(fdb_doc *)auStack_1468._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e37;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00117e3c;
    pfStack_1480 = (fdb_kvs_handle *)0x1173db;
    fdb_doc_free((fdb_doc *)auStack_1468._0_8_);
    uVar10 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  lVar11 = 0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x1173f6;
    fdb_set((fdb_kvs_handle *)auStack_1468._8_8_,*(fdb_doc **)(auStack_1308 + lVar11 * 8 + 0x28));
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  pfStack_1480 = (fdb_kvs_handle *)0x11740b;
  fdb_commit((fdb_file_handle *)auStack_1448._0_8_,'\0');
  pcVar12 = auStack_1308 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x117430;
    sprintf(pcVar12,"key%d",doc_00);
    pfStack_1480 = (fdb_kvs_handle *)0x117438;
    sVar5 = strlen(pcVar12);
    pfStack_1480 = (fdb_kvs_handle *)0x117456;
    fdb_doc_create((fdb_doc **)auStack_1468,pcVar12,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x117465;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1468._8_8_,(fdb_doc *)auStack_1468._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117d90;
    pfStack_1480 = (fdb_kvs_handle *)0x117477;
    fdb_doc_free((fdb_doc *)auStack_1468._0_8_);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_1480 = (fdb_kvs_handle *)0x11748d;
  fdb_begin_transaction(pfStack_1450,'\x02');
  pfStack_1480 = (fdb_kvs_handle *)0x11749c;
  fdb_begin_transaction((fdb_file_handle *)auStack_1448._16_8_,'\x02');
  uVar15 = 0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x1174bb;
    sprintf(auStack_1308 + 0x50,"key%d",uVar15);
    doc_00 = &fStack_11a8;
    pfStack_1480 = (fdb_kvs_handle *)0x1174d7;
    sprintf((char *)doc_00,"meta%d",uVar15);
    pcVar22 = auStack_1420 + 0x18;
    pfStack_1480 = (fdb_kvs_handle *)0x1174f0;
    sprintf(pcVar22,"body%d_txn1",uVar15);
    pfStack_1480 = (fdb_kvs_handle *)0x1174f8;
    sVar5 = strlen(auStack_1308 + 0x50);
    pfStack_1480 = (fdb_kvs_handle *)0x117503;
    sVar6 = strlen((char *)doc_00);
    pfStack_1480 = (fdb_kvs_handle *)0x11750e;
    sVar7 = strlen(pcVar22);
    pcVar12 = auStack_1308 + 0x50;
    pfStack_1480 = (fdb_kvs_handle *)0x117533;
    fdb_doc_create((fdb_doc **)auStack_1468,pcVar12,sVar5,doc_00,sVar6,pcVar22,sVar7);
    pfStack_1480 = (fdb_kvs_handle *)0x117542;
    fdb_set(pfStack_1458,(fdb_doc *)auStack_1468._0_8_);
    pfStack_1480 = (fdb_kvs_handle *)0x11754c;
    fdb_doc_free((fdb_doc *)auStack_1468._0_8_);
    pfStack_1480 = (fdb_kvs_handle *)0x117560;
    sprintf(pcVar22,"body%d_txn2",uVar15);
    pfStack_1480 = (fdb_kvs_handle *)0x117568;
    sVar5 = strlen(pcVar12);
    pfStack_1480 = (fdb_kvs_handle *)0x117573;
    sVar6 = strlen((char *)doc_00);
    pfStack_1480 = (fdb_kvs_handle *)0x11757e;
    sVar7 = strlen(pcVar22);
    pfStack_1480 = (fdb_kvs_handle *)0x11759b;
    fdb_doc_create((fdb_doc **)auStack_1468,pcVar12,sVar5,doc_00,sVar6,pcVar22,sVar7);
    pfStack_1480 = (fdb_kvs_handle *)0x1175aa;
    fdb_set((fdb_kvs_handle *)auStack_1448._8_8_,(fdb_doc *)auStack_1468._0_8_);
    pfStack_1480 = (fdb_kvs_handle *)0x1175b4;
    fdb_doc_free((fdb_doc *)auStack_1468._0_8_);
    uVar10 = (int)uVar15 + 1;
    uVar15 = (ulong)uVar10;
  } while (uVar10 != 10);
  pfVar18 = (fdb_kvs_handle *)auStack_1468;
  handle = (fdb_kvs_handle *)(auStack_1420 + 0x18);
  pcVar12 = (char *)0x0;
  do {
    config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
    pfStack_1480 = (fdb_kvs_handle *)0x1175e8;
    sprintf((char *)config,"key%d",(ulong)pcVar12 & 0xffffffff);
    pfStack_1480 = (fdb_kvs_handle *)0x1175f0;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x11760e;
    fdb_doc_create((fdb_doc **)pfVar18,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x11761d;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1468._8_8_,(fdb_doc *)auStack_1468._0_8_);
    pfVar17 = (fdb_kvs_handle *)auStack_1468._0_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117da0;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1468._0_8_ + 0x40))->seqtree
    ;
    pfVar9 = *(fdb_kvs_handle **)(*(long *)(auStack_1308 + (long)pcVar12 * 8) + 0x40);
    pfStack_1480 = (fdb_kvs_handle *)0x117651;
    iVar4 = bcmp(doc_00,pfVar9,(size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
    config = handle;
    if (iVar4 != 0) goto LAB_00117d95;
    pfStack_1480 = (fdb_kvs_handle *)0x117661;
    fdb_doc_free((fdb_doc *)pfVar17);
    pcVar22 = auStack_1308 + 0x50;
    pfStack_1480 = (fdb_kvs_handle *)0x117671;
    sVar5 = strlen(pcVar22);
    pfStack_1480 = (fdb_kvs_handle *)0x117692;
    fdb_doc_create((fdb_doc **)pfVar18,pcVar22,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x1176a1;
    fVar3 = fdb_get(pfStack_1458,(fdb_doc *)auStack_1468._0_8_);
    pfVar17 = pfVar18;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117db2;
    pfStack_1480 = (fdb_kvs_handle *)0x1176bf;
    sprintf((char *)handle,"body%d_txn1",(ulong)pcVar12 & 0xffffffff);
    pcVar22 = (char *)auStack_1468._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1468._0_8_ + 0x40))->seqtree
    ;
    pfStack_1480 = (fdb_kvs_handle *)0x1176d9;
    iVar4 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
    if (iVar4 != 0) goto LAB_00117da5;
    pfStack_1480 = (fdb_kvs_handle *)0x1176e9;
    fdb_doc_free((fdb_doc *)pcVar22);
    config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
    pfStack_1480 = (fdb_kvs_handle *)0x1176f9;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x117717;
    fdb_doc_create((fdb_doc **)pfVar18,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x117726;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1448._8_8_,(fdb_doc *)auStack_1468._0_8_);
    pfVar9 = pfVar18;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dc4;
    pfStack_1480 = (fdb_kvs_handle *)0x117741;
    sprintf((char *)handle,"body%d_txn2",(ulong)pcVar12 & 0xffffffff);
    pcVar22 = (char *)auStack_1468._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1468._0_8_ + 0x40))->seqtree
    ;
    pfStack_1480 = (fdb_kvs_handle *)0x11775b;
    iVar4 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
    if (iVar4 != 0) goto LAB_00117db7;
    pfStack_1480 = (fdb_kvs_handle *)0x11776b;
    fdb_doc_free((fdb_doc *)pcVar22);
    pcVar12 = &(((fdb_kvs_handle *)pcVar12)->kvs_config).field_0x1;
  } while (pcVar12 != (undefined1 *)0xa);
  pfStack_1480 = (fdb_kvs_handle *)0x117784;
  fdb_end_transaction((fdb_file_handle *)auStack_1448._16_8_,'\0');
  config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_1468;
  handle = (fdb_kvs_handle *)(auStack_1420 + 0x18);
  pcVar12 = (char *)0x0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x1177ab;
    sprintf((char *)config,"key%d",pcVar12);
    pfStack_1480 = (fdb_kvs_handle *)0x1177b3;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x1177d1;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x1177e0;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1468._8_8_,(fdb_doc *)auStack_1468._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dd6;
    pfStack_1480 = (fdb_kvs_handle *)0x1177fb;
    sprintf((char *)handle,"body%d_txn2",pcVar12);
    pcVar22 = (char *)auStack_1468._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1468._0_8_ + 0x40))->seqtree
    ;
    pfStack_1480 = (fdb_kvs_handle *)0x117815;
    iVar4 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
    if (iVar4 != 0) goto LAB_00117dc9;
    pfStack_1480 = (fdb_kvs_handle *)0x117825;
    fdb_doc_free((fdb_doc *)pcVar22);
    pfStack_1480 = (fdb_kvs_handle *)0x11782d;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x11784b;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x11785a;
    fVar3 = fdb_get(pfStack_1458,(fdb_doc *)auStack_1468._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117de8;
    pfStack_1480 = (fdb_kvs_handle *)0x117875;
    sprintf((char *)handle,"body%d_txn1",pcVar12);
    pcVar22 = (char *)auStack_1468._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1468._0_8_ + 0x40))->seqtree
    ;
    pfStack_1480 = (fdb_kvs_handle *)0x11788f;
    iVar4 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
    if (iVar4 != 0) goto LAB_00117ddb;
    pfStack_1480 = (fdb_kvs_handle *)0x11789f;
    fdb_doc_free((fdb_doc *)pcVar22);
    uVar10 = (int)pcVar12 + 1;
    pcVar12 = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_1480 = (fdb_kvs_handle *)0x1178b6;
  fdb_end_transaction(pfStack_1450,'\0');
  config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
  pcVar22 = "body%d_txn1";
  handle = (fdb_kvs_handle *)(auStack_1420 + 0x18);
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x1178df;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_1480 = (fdb_kvs_handle *)0x1178e7;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x117907;
    fdb_doc_create((fdb_doc **)auStack_1468,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x117916;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1468._8_8_,(fdb_doc *)auStack_1468._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dfa;
    pfStack_1480 = (fdb_kvs_handle *)0x11792d;
    sprintf((char *)handle,"body%d_txn1",doc_00);
    pcVar12 = (char *)auStack_1468._0_8_;
    pfVar9 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1468._0_8_ + 0x40))->seqtree
    ;
    pfStack_1480 = (fdb_kvs_handle *)0x117945;
    iVar4 = bcmp(pfVar9,handle,(size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
    if (iVar4 != 0) goto LAB_00117ded;
    pfStack_1480 = (fdb_kvs_handle *)0x117955;
    fdb_doc_free((fdb_doc *)pcVar12);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_1480 = (fdb_kvs_handle *)0x11796f;
  fdb_begin_transaction(pfStack_1450,'\x02');
  pfVar17 = (fdb_kvs_handle *)(auStack_1308 + 0x50);
  pfStack_1480 = (fdb_kvs_handle *)0x11798d;
  sprintf((char *)pfVar17,"key%d",5);
  pfVar9 = &fStack_11a8;
  pfStack_1480 = (fdb_kvs_handle *)0x1179ab;
  sprintf((char *)pfVar9,"meta%d",5);
  pcVar22 = auStack_1420 + 0x18;
  pfStack_1480 = (fdb_kvs_handle *)0x1179c6;
  sprintf(pcVar22,"body%d_before_compaction",5);
  pfStack_1480 = (fdb_kvs_handle *)0x1179ce;
  handle = (fdb_kvs_handle *)strlen((char *)pfVar17);
  pfStack_1480 = (fdb_kvs_handle *)0x1179d9;
  doc_00 = (fdb_kvs_handle *)strlen((char *)pfVar9);
  pfStack_1480 = (fdb_kvs_handle *)0x1179e4;
  sVar5 = strlen(pcVar22);
  config = (fdb_kvs_handle *)auStack_1468;
  pfStack_1480 = (fdb_kvs_handle *)0x117a04;
  fdb_doc_create((fdb_doc **)config,pfVar17,(size_t)handle,pfVar9,(size_t)doc_00,pcVar22,sVar5);
  pfStack_1480 = (fdb_kvs_handle *)0x117a11;
  fdb_set(pfStack_1458,(fdb_doc *)auStack_1468._0_8_);
  pfStack_1480 = (fdb_kvs_handle *)0x117a19;
  fdb_doc_free((fdb_doc *)auStack_1468._0_8_);
  pfStack_1480 = (fdb_kvs_handle *)0x117a2a;
  fdb_compact((fdb_file_handle *)auStack_1448._0_8_,"mvcc_test2");
  pfStack_1480 = (fdb_kvs_handle *)0x117a32;
  sVar5 = strlen((char *)pfVar17);
  pfStack_1480 = (fdb_kvs_handle *)0x117a50;
  fdb_doc_create((fdb_doc **)config,pfVar17,sVar5,(void *)0x0,0,(void *)0x0,0);
  pfStack_1480 = (fdb_kvs_handle *)0x117a5d;
  fVar3 = fdb_get(pfStack_1458,(fdb_doc *)auStack_1468._0_8_);
  pcVar12 = (char *)auStack_1468._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e4b;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1468._0_8_ + 0x40))->seqtree;
  pfStack_1480 = (fdb_kvs_handle *)0x117a7f;
  iVar4 = bcmp(config,auStack_1420 + 0x18,
               (size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
  if (iVar4 != 0) goto LAB_00117e50;
  pfStack_1480 = (fdb_kvs_handle *)0x117a8f;
  fdb_doc_free((fdb_doc *)pcVar12);
  pcVar12 = auStack_1308 + 0x50;
  pfStack_1480 = (fdb_kvs_handle *)0x117a9f;
  sVar5 = strlen(pcVar12);
  config = (fdb_kvs_handle *)auStack_1468;
  pfStack_1480 = (fdb_kvs_handle *)0x117ac2;
  fdb_doc_create((fdb_doc **)config,pcVar12,sVar5,(void *)0x0,0,(void *)0x0,0);
  pfStack_1480 = (fdb_kvs_handle *)0x117acf;
  fVar3 = fdb_get((fdb_kvs_handle *)auStack_1468._8_8_,(fdb_doc *)auStack_1468._0_8_);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e5d;
  pfVar9 = (fdb_kvs_handle *)(auStack_1420 + 0x18);
  pfStack_1480 = (fdb_kvs_handle *)0x117af2;
  sprintf((char *)pfVar9,"body%d_txn1",5);
  pcVar12 = (char *)auStack_1468._0_8_;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1468._0_8_ + 0x40))->seqtree;
  pfStack_1480 = (fdb_kvs_handle *)0x117b0a;
  iVar4 = bcmp(config,pfVar9,(size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
  if (iVar4 != 0) goto LAB_00117e62;
  pfStack_1480 = (fdb_kvs_handle *)0x117b1a;
  fdb_doc_free((fdb_doc *)pcVar12);
  pfStack_1480 = (fdb_kvs_handle *)0x117b26;
  fdb_end_transaction(pfStack_1450,'\0');
  config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_1468;
  handle = (fdb_kvs_handle *)(auStack_1420 + 0x18);
  pcVar22 = (char *)0x0;
  do {
    pfStack_1480 = (fdb_kvs_handle *)0x117b4f;
    sprintf((char *)config,"key%d",pcVar22);
    pfStack_1480 = (fdb_kvs_handle *)0x117b57;
    sVar5 = strlen((char *)config);
    pfStack_1480 = (fdb_kvs_handle *)0x117b75;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_1480 = (fdb_kvs_handle *)0x117b84;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_1468._8_8_,(fdb_doc *)auStack_1468._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e0c;
    if ((int)pcVar22 == 5) {
      pcVar12 = "body%d_before_compaction";
      pfVar17 = (fdb_kvs_handle *)0x5;
    }
    else {
      pcVar12 = "body%d_txn1";
      pfVar17 = (fdb_kvs_handle *)pcVar22;
    }
    pfStack_1480 = (fdb_kvs_handle *)0x117bb4;
    sprintf((char *)handle,pcVar12,pfVar17);
    doc_00 = (fdb_kvs_handle *)auStack_1468._0_8_;
    pcVar12 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1468._0_8_ + 0x40))
                      ->seqtree;
    pfStack_1480 = (fdb_kvs_handle *)0x117bcc;
    iVar4 = bcmp(pcVar12,handle,(size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
    if (iVar4 != 0) goto LAB_00117dff;
    pfStack_1480 = (fdb_kvs_handle *)0x117bdc;
    fdb_doc_free((fdb_doc *)doc_00);
    uVar10 = (int)pcVar22 + 1;
    pcVar22 = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_1480 = (fdb_kvs_handle *)0x117bf6;
  fdb_close((fdb_file_handle *)auStack_1448._0_8_);
  pfStack_1480 = (fdb_kvs_handle *)0x117c0d;
  fdb_open((fdb_file_handle **)auStack_1448,"mvcc_test2",
           (fdb_config *)&fStack_11a8.config.encryption_key);
  pcVar12 = auStack_1468 + 8;
  pfStack_1480 = (fdb_kvs_handle *)0x117c22;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1448._0_8_,(fdb_kvs_handle **)pcVar12,
             (fdb_kvs_config *)auStack_1420);
  pfStack_1480 = (fdb_kvs_handle *)0x117c38;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1468._8_8_,logCallbackFunc,"transaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
    pfVar9 = (fdb_kvs_handle *)auStack_1468;
    handle = (fdb_kvs_handle *)(auStack_1420 + 0x18);
    pcVar22 = (char *)0x0;
    while( true ) {
      pfStack_1480 = (fdb_kvs_handle *)0x117c69;
      sprintf((char *)config,"key%d",pcVar22);
      pfStack_1480 = (fdb_kvs_handle *)0x117c71;
      sVar5 = strlen((char *)config);
      pfStack_1480 = (fdb_kvs_handle *)0x117c8f;
      fdb_doc_create((fdb_doc **)pfVar9,config,sVar5,(void *)0x0,0,(void *)0x0,0);
      pfStack_1480 = (fdb_kvs_handle *)0x117c9e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_1468._8_8_,(fdb_doc *)auStack_1468._0_8_);
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      if ((int)pcVar22 == 5) {
        pcVar12 = "body%d_before_compaction";
        pfVar17 = (fdb_kvs_handle *)0x5;
      }
      else {
        pcVar12 = "body%d_txn1";
        pfVar17 = (fdb_kvs_handle *)pcVar22;
      }
      pfStack_1480 = (fdb_kvs_handle *)0x117cce;
      sprintf((char *)handle,pcVar12,pfVar17);
      doc_00 = (fdb_kvs_handle *)auStack_1468._0_8_;
      pcVar12 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                        (auStack_1468._0_8_ + 0x40))->seqtree;
      pfStack_1480 = (fdb_kvs_handle *)0x117ce6;
      iVar4 = bcmp(pcVar12,handle,(size_t)((fdb_kvs_config *)auStack_1468._0_8_)->custom_cmp_param);
      if (iVar4 != 0) goto LAB_00117e11;
      pfStack_1480 = (fdb_kvs_handle *)0x117cf6;
      fdb_doc_free((fdb_doc *)doc_00);
      uVar10 = (int)pcVar22 + 1;
      pcVar22 = (char *)(ulong)uVar10;
      if (uVar10 == 10) {
        pfStack_1480 = (fdb_kvs_handle *)0x117d0d;
        fdb_close((fdb_file_handle *)auStack_1448._0_8_);
        pfStack_1480 = (fdb_kvs_handle *)0x117d17;
        fdb_close(pfStack_1450);
        pfStack_1480 = (fdb_kvs_handle *)0x117d21;
        fdb_close((fdb_file_handle *)auStack_1448._16_8_);
        lVar11 = 0;
        do {
          pfStack_1480 = (fdb_kvs_handle *)0x117d30;
          fdb_doc_free(*(fdb_doc **)(auStack_1308 + lVar11 * 8));
          lVar11 = lVar11 + 1;
        } while (lVar11 != 10);
        pfStack_1480 = (fdb_kvs_handle *)0x117d3e;
        fdb_shutdown();
        pfStack_1480 = (fdb_kvs_handle *)0x117d43;
        memleak_end();
        pcVar12 = "%s PASSED\n";
        if (transaction_test()::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pfStack_1480 = (fdb_kvs_handle *)0x117d74;
        fprintf(_stderr,pcVar12,"transaction test");
        return;
      }
    }
    goto LAB_00117e1e;
  }
  goto LAB_00117e6f;
LAB_0011849b:
  pfStack_1818 = (fdb_kvs_handle *)0x1184a8;
  transaction_simple_api_test();
  pfVar18 = pfVar17;
LAB_001184a8:
  pfStack_1818 = (fdb_kvs_handle *)0x1184ad;
  transaction_simple_api_test();
LAB_001184ad:
  pfStack_1818 = (fdb_kvs_handle *)0x1184ba;
  transaction_simple_api_test();
  pfVar17 = pfVar18;
LAB_001184ba:
  pfStack_1818 = (fdb_kvs_handle *)0x1184bf;
  transaction_simple_api_test();
LAB_001184bf:
  pfStack_1818 = (fdb_kvs_handle *)0x1184cc;
  transaction_simple_api_test();
  pfVar9 = pfVar17;
LAB_001184cc:
  pfStack_1818 = (fdb_kvs_handle *)0x1184d1;
  transaction_simple_api_test();
LAB_001184d1:
  pfStack_1818 = (fdb_kvs_handle *)0x1184de;
  transaction_simple_api_test();
  pfVar17 = pfVar9;
LAB_001184de:
  pfVar9 = pfVar17;
  pfStack_1818 = (fdb_kvs_handle *)0x1184e3;
  transaction_simple_api_test();
LAB_001184e3:
  pfStack_1818 = (fdb_kvs_handle *)0x1184e8;
  transaction_simple_api_test();
LAB_001184e8:
  pfVar18 = pfVar9;
  pfStack_1818 = (fdb_kvs_handle *)0x1184ed;
  transaction_simple_api_test();
LAB_001184ed:
  pfStack_1818 = (fdb_kvs_handle *)0x1184fa;
  transaction_simple_api_test();
LAB_001184fa:
  pfVar9 = (fdb_kvs_handle *)auStack_17a0;
  pfStack_1818 = (fdb_kvs_handle *)0x118507;
  transaction_simple_api_test();
  pfVar17 = (fdb_kvs_handle *)pcVar22;
  goto LAB_00118507;
LAB_00117d8b:
  pfStack_1480 = (fdb_kvs_handle *)0x117d90;
  transaction_test();
LAB_00117d90:
  pfVar9 = (fdb_kvs_handle *)auStack_1468;
  config = (fdb_kvs_handle *)(auStack_1308 + 0x50);
  pcVar12 = "key%d";
  pfStack_1480 = (fdb_kvs_handle *)0x117d95;
  transaction_test();
LAB_00117d95:
  pfStack_1480 = (fdb_kvs_handle *)0x117da0;
  transaction_test();
  pcVar22 = (char *)pfVar17;
  handle = pfVar18;
  pfVar18 = pfVar9;
LAB_00117da0:
  pfStack_1480 = (fdb_kvs_handle *)0x117da5;
  transaction_test();
LAB_00117da5:
  pfStack_1480 = (fdb_kvs_handle *)0x117db2;
  transaction_test();
  pfVar17 = handle;
LAB_00117db2:
  handle = pfVar17;
  pfStack_1480 = (fdb_kvs_handle *)0x117db7;
  transaction_test();
  pfVar9 = pfVar18;
LAB_00117db7:
  pfStack_1480 = (fdb_kvs_handle *)0x117dc4;
  transaction_test();
LAB_00117dc4:
  pfStack_1480 = (fdb_kvs_handle *)0x117dc9;
  transaction_test();
LAB_00117dc9:
  pfStack_1480 = (fdb_kvs_handle *)0x117dd6;
  transaction_test();
LAB_00117dd6:
  pfStack_1480 = (fdb_kvs_handle *)0x117ddb;
  transaction_test();
LAB_00117ddb:
  pfStack_1480 = (fdb_kvs_handle *)0x117de8;
  transaction_test();
LAB_00117de8:
  pfStack_1480 = (fdb_kvs_handle *)0x117ded;
  transaction_test();
LAB_00117ded:
  pfStack_1480 = (fdb_kvs_handle *)0x117dfa;
  transaction_test();
LAB_00117dfa:
  pfStack_1480 = (fdb_kvs_handle *)0x117dff;
  transaction_test();
LAB_00117dff:
  pfStack_1480 = (fdb_kvs_handle *)0x117e0c;
  transaction_test();
LAB_00117e0c:
  pfStack_1480 = (fdb_kvs_handle *)0x117e11;
  transaction_test();
LAB_00117e11:
  pfStack_1480 = (fdb_kvs_handle *)0x117e1e;
  transaction_test();
LAB_00117e1e:
  pfStack_1480 = (fdb_kvs_handle *)0x117e23;
  transaction_test();
  pfVar17 = (fdb_kvs_handle *)pcVar22;
  pfVar18 = handle;
LAB_00117e23:
  pfStack_1480 = (fdb_kvs_handle *)0x117e28;
  transaction_test();
LAB_00117e28:
  pfStack_1480 = (fdb_kvs_handle *)0x117e2d;
  transaction_test();
LAB_00117e2d:
  pfStack_1480 = (fdb_kvs_handle *)0x117e32;
  transaction_test();
LAB_00117e32:
  pfStack_1480 = (fdb_kvs_handle *)0x117e37;
  transaction_test();
LAB_00117e37:
  pfStack_1480 = (fdb_kvs_handle *)0x117e3c;
  transaction_test();
LAB_00117e3c:
  pfStack_1480 = (fdb_kvs_handle *)0x117e41;
  transaction_test();
LAB_00117e41:
  pfStack_1480 = (fdb_kvs_handle *)0x117e46;
  transaction_test();
  pcVar22 = (char *)pfVar17;
  handle = pfVar18;
LAB_00117e46:
  pfStack_1480 = (fdb_kvs_handle *)0x117e4b;
  transaction_test();
  pfVar17 = (fdb_kvs_handle *)pcVar12;
LAB_00117e4b:
  pcVar12 = (char *)pfVar17;
  pfStack_1480 = (fdb_kvs_handle *)0x117e50;
  transaction_test();
LAB_00117e50:
  pfStack_1480 = (fdb_kvs_handle *)0x117e5d;
  transaction_test();
LAB_00117e5d:
  pfStack_1480 = (fdb_kvs_handle *)0x117e62;
  transaction_test();
LAB_00117e62:
  pfStack_1480 = (fdb_kvs_handle *)0x117e6f;
  transaction_test();
LAB_00117e6f:
  pfStack_1480 = (fdb_kvs_handle *)transaction_simple_api_test;
  transaction_test();
  pfStack_1818 = (fdb_kvs_handle *)0x117e91;
  pfStack_14a8 = (fdb_kvs_handle *)pcVar12;
  pfStack_14a0 = (fdb_kvs_handle *)pcVar22;
  pfStack_1498 = handle;
  pfStack_1490 = config;
  pfStack_1488 = pfVar9;
  pfStack_1480 = doc_00;
  gettimeofday(&tStack_17b0,(__timezone_ptr_t)0x0);
  pfStack_1818 = (fdb_kvs_handle *)0x117e96;
  memleak_start();
  pfStack_1818 = (fdb_kvs_handle *)0x117ea2;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1818 = (fdb_kvs_handle *)0x117eb2;
  fdb_get_default_config();
  config_00 = &fStack_17c8;
  pfStack_1818 = (fdb_kvs_handle *)0x117ebf;
  fdb_get_default_kvs_config();
  fStack_15a0.buffercache_size = 0;
  fStack_15a0.wal_threshold = 0x400;
  fStack_15a0.flags = 1;
  fStack_15a0.purging_interval = 0;
  fStack_15a0.compaction_threshold = '\0';
  pfVar17 = (fdb_kvs_handle *)&phStack_17d0;
  pfStack_1818 = (fdb_kvs_handle *)0x117ef8;
  fdb_open((fdb_file_handle **)pfVar17,"./mvcc_test1",&fStack_15a0);
  pfVar18 = (fdb_kvs_handle *)&pfStack_17f8;
  pfStack_1818 = (fdb_kvs_handle *)0x117f0b;
  fdb_kvs_open_default((fdb_file_handle *)phStack_17d0,(fdb_kvs_handle **)pfVar18,config_00);
  pfStack_1818 = (fdb_kvs_handle *)0x117f21;
  pfVar9 = pfStack_17f8;
  fVar3 = fdb_set_log_callback(pfStack_17f8,logCallbackFunc,"transaction_simple_api_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcVar12 = auStack_17a0 + 0x100;
    pcVar22 = "body%d";
    doc_00 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1818 = (fdb_kvs_handle *)0x117f52;
      sprintf(pcVar12,"key%d",doc_00);
      pfStack_1818 = (fdb_kvs_handle *)0x117f61;
      sprintf(auStack_17a0,"body%d",doc_00);
      handle = pfStack_17f8;
      pfStack_1818 = (fdb_kvs_handle *)0x117f6e;
      pfVar17 = (fdb_kvs_handle *)strlen(pcVar12);
      pfStack_1818 = (fdb_kvs_handle *)0x117f79;
      sVar5 = strlen(auStack_17a0);
      pfStack_1818 = (fdb_kvs_handle *)0x117f8d;
      fVar3 = fdb_set_kv(handle,pcVar12,(size_t)pfVar17,auStack_17a0,sVar5);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1818 = (fdb_kvs_handle *)0x11849b;
        transaction_simple_api_test();
        goto LAB_0011849b;
      }
      uVar10 = (int)doc_00 + 1;
      doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
    } while (uVar10 != 10);
    pfStack_1818 = (fdb_kvs_handle *)0x117fa8;
    fdb_commit((fdb_file_handle *)phStack_17d0,'\0');
    pfStack_1818 = (fdb_kvs_handle *)0x117fca;
    fdb_open((fdb_file_handle **)&phStack_17d8,"./mvcc_test1",&fStack_15a0);
    pfStack_1818 = (fdb_kvs_handle *)0x117fdd;
    fdb_open((fdb_file_handle **)&pkStack_17e0,"./mvcc_test1",&fStack_15a0);
    pfStack_1818 = (fdb_kvs_handle *)0x117ff2;
    fdb_kvs_open_default((fdb_file_handle *)phStack_17d8,&pfStack_17e8,&fStack_17c8);
    pfStack_1818 = (fdb_kvs_handle *)0x118003;
    fdb_kvs_open_default((fdb_file_handle *)pkStack_17e0,&pfStack_17f0,&fStack_17c8);
    pfStack_1818 = (fdb_kvs_handle *)0x118010;
    fdb_begin_transaction((fdb_file_handle *)phStack_17d8,'\x02');
    pfStack_1818 = (fdb_kvs_handle *)0x11801e;
    fdb_begin_transaction((fdb_file_handle *)pkStack_17e0,'\x02');
    pcVar12 = auStack_17a0 + 0x100;
    uVar10 = 0;
    do {
      pfStack_1818 = (fdb_kvs_handle *)0x118043;
      sprintf(pcVar12,"key%d",(ulong)uVar10);
      pfStack_1818 = (fdb_kvs_handle *)0x118056;
      sprintf(auStack_17a0,"body%d_txn1",(ulong)uVar10);
      pfVar17 = pfStack_17e8;
      pfStack_1818 = (fdb_kvs_handle *)0x118063;
      sVar5 = strlen(pcVar12);
      pfStack_1818 = (fdb_kvs_handle *)0x11806e;
      sVar6 = strlen(auStack_17a0);
      pfStack_1818 = (fdb_kvs_handle *)0x118082;
      fdb_set_kv(pfVar17,pcVar12,sVar5,auStack_17a0,sVar6);
      pfStack_1818 = (fdb_kvs_handle *)0x118091;
      sprintf(pcVar12,"key%d",(ulong)uVar10);
      pfStack_1818 = (fdb_kvs_handle *)0x1180a4;
      sprintf(auStack_17a0,"body%d_txn2",(ulong)uVar10);
      pfVar17 = pfStack_17f0;
      pfStack_1818 = (fdb_kvs_handle *)0x1180b1;
      sVar5 = strlen(pcVar12);
      pfStack_1818 = (fdb_kvs_handle *)0x1180bc;
      sVar6 = strlen(auStack_17a0);
      pfStack_1818 = (fdb_kvs_handle *)0x1180d0;
      fdb_set_kv(pfVar17,pcVar12,sVar5,auStack_17a0,sVar6);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 10);
    pcVar12 = auStack_17a0 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_1808;
    doc_00 = (fdb_kvs_handle *)&p_Stack_1800;
    pcVar22 = (char *)0x0;
    do {
      pfStack_1818 = (fdb_kvs_handle *)0x118109;
      sprintf(pcVar12,"key%d",pcVar22);
      pfStack_1818 = (fdb_kvs_handle *)0x11811d;
      sprintf(auStack_17a0,"body%d",pcVar22);
      pfVar18 = pfStack_17f8;
      pfStack_1818 = (fdb_kvs_handle *)0x11812a;
      sVar5 = strlen(pcVar12);
      pfStack_1818 = (fdb_kvs_handle *)0x11813e;
      fVar3 = fdb_get_kv(pfVar18,pcVar12,sVar5,(void **)handle,(size_t *)doc_00);
      pfVar17 = pfStack_1808;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184a8;
      pfStack_1818 = (fdb_kvs_handle *)0x11815b;
      iVar4 = bcmp(pfStack_1808,auStack_17a0,(size_t)p_Stack_1800);
      if (iVar4 != 0) goto LAB_0011849b;
      pfStack_1818 = (fdb_kvs_handle *)0x11816b;
      fdb_free_block(pfVar17);
      pfStack_1818 = (fdb_kvs_handle *)0x11817f;
      sprintf(pcVar12,"key%d",pcVar22);
      pfStack_1818 = (fdb_kvs_handle *)0x118193;
      sprintf(auStack_17a0,"body%d_txn1",pcVar22);
      pfVar17 = pfStack_17e8;
      pfStack_1818 = (fdb_kvs_handle *)0x1181a0;
      sVar5 = strlen(pcVar12);
      pfStack_1818 = (fdb_kvs_handle *)0x1181b4;
      fVar3 = fdb_get_kv(pfVar17,pcVar12,sVar5,(void **)handle,(size_t *)doc_00);
      pfVar18 = pfStack_1808;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184ba;
      pfStack_1818 = (fdb_kvs_handle *)0x1181d1;
      iVar4 = bcmp(pfStack_1808,auStack_17a0,(size_t)p_Stack_1800);
      if (iVar4 != 0) goto LAB_001184ad;
      pfStack_1818 = (fdb_kvs_handle *)0x1181e1;
      fdb_free_block(pfVar18);
      pfStack_1818 = (fdb_kvs_handle *)0x1181f5;
      sprintf(pcVar12,"key%d",pcVar22);
      pfStack_1818 = (fdb_kvs_handle *)0x118209;
      sprintf(auStack_17a0,"body%d_txn2",pcVar22);
      pfVar9 = pfStack_17f0;
      pfStack_1818 = (fdb_kvs_handle *)0x118216;
      sVar5 = strlen(pcVar12);
      pfStack_1818 = (fdb_kvs_handle *)0x11822a;
      fVar3 = fdb_get_kv(pfVar9,pcVar12,sVar5,(void **)handle,(size_t *)doc_00);
      pfVar17 = pfStack_1808;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184cc;
      pfStack_1818 = (fdb_kvs_handle *)0x118247;
      iVar4 = bcmp(pfStack_1808,auStack_17a0,(size_t)p_Stack_1800);
      if (iVar4 != 0) goto LAB_001184bf;
      pfStack_1818 = (fdb_kvs_handle *)0x118257;
      fdb_free_block(pfVar17);
      uVar10 = (int)pcVar22 + 1;
      pcVar22 = (char *)(ulong)uVar10;
    } while (uVar10 != 10);
    pfStack_1818 = (fdb_kvs_handle *)0x118270;
    fdb_end_transaction((fdb_file_handle *)phStack_17d8,'\0');
    pcVar12 = auStack_17a0 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_1808;
    doc_00 = (fdb_kvs_handle *)&p_Stack_1800;
    pcVar22 = (char *)0x0;
    do {
      pfStack_1818 = (fdb_kvs_handle *)0x11829e;
      sprintf(pcVar12,"key%d",pcVar22);
      pfStack_1818 = (fdb_kvs_handle *)0x1182b2;
      sprintf(auStack_17a0,"body%d_txn1",pcVar22);
      pfVar17 = pfStack_17f8;
      pfStack_1818 = (fdb_kvs_handle *)0x1182bf;
      sVar5 = strlen(pcVar12);
      pfStack_1818 = (fdb_kvs_handle *)0x1182d3;
      fVar3 = fdb_get_kv(pfVar17,pcVar12,sVar5,(void **)handle,(size_t *)doc_00);
      pfVar9 = pfStack_1808;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184de;
      pfStack_1818 = (fdb_kvs_handle *)0x1182f0;
      iVar4 = bcmp(pfStack_1808,auStack_17a0,(size_t)p_Stack_1800);
      if (iVar4 != 0) goto LAB_001184d1;
      pfStack_1818 = (fdb_kvs_handle *)0x118300;
      fVar3 = fdb_free_block(pfVar9);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184e3;
      pfStack_1818 = (fdb_kvs_handle *)0x11831c;
      sprintf(pcVar12,"key%d",pcVar22);
      pfStack_1818 = (fdb_kvs_handle *)0x118330;
      sprintf(auStack_17a0,"body%d_txn2",pcVar22);
      pfVar9 = pfStack_17f0;
      pfStack_1818 = (fdb_kvs_handle *)0x11833d;
      sVar5 = strlen(pcVar12);
      pfStack_1818 = (fdb_kvs_handle *)0x118351;
      fVar3 = fdb_get_kv(pfVar9,pcVar12,sVar5,(void **)handle,(size_t *)doc_00);
      pfVar18 = pfStack_1808;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184e8;
      pfStack_1818 = (fdb_kvs_handle *)0x11836e;
      iVar4 = bcmp(pfStack_1808,auStack_17a0,(size_t)p_Stack_1800);
      if (iVar4 != 0) goto LAB_001184ed;
      pfStack_1818 = (fdb_kvs_handle *)0x11837e;
      fdb_free_block(pfVar18);
      uVar10 = (int)pcVar22 + 1;
      pcVar22 = (char *)(ulong)uVar10;
    } while (uVar10 != 10);
    pfStack_1818 = (fdb_kvs_handle *)0x118397;
    fdb_end_transaction((fdb_file_handle *)pkStack_17e0,'\0');
    pcVar12 = auStack_17a0 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_1808;
    doc_00 = (fdb_kvs_handle *)&p_Stack_1800;
    pfVar18 = (fdb_kvs_handle *)0x0;
    while( true ) {
      pfStack_1818 = (fdb_kvs_handle *)0x1183c3;
      sprintf(pcVar12,"key%d",pfVar18);
      pfStack_1818 = (fdb_kvs_handle *)0x1183d6;
      sprintf(auStack_17a0,"body%d_txn2",pfVar18);
      pfVar17 = pfStack_17f8;
      pfStack_1818 = (fdb_kvs_handle *)0x1183e3;
      sVar5 = strlen(pcVar12);
      pfStack_1818 = (fdb_kvs_handle *)0x1183f7;
      pfVar9 = pfVar17;
      fVar3 = fdb_get_kv(pfVar17,pcVar12,sVar5,(void **)handle,(size_t *)doc_00);
      pcVar22 = (char *)pfStack_1808;
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      pfStack_1818 = (fdb_kvs_handle *)0x118414;
      iVar4 = bcmp(pfStack_1808,auStack_17a0,(size_t)p_Stack_1800);
      if (iVar4 != 0) goto LAB_001184fa;
      pfStack_1818 = (fdb_kvs_handle *)0x118424;
      fdb_free_block(pcVar22);
      uVar10 = (int)pfVar18 + 1;
      pfVar18 = (fdb_kvs_handle *)(ulong)uVar10;
      if (uVar10 == 10) {
        pfStack_1818 = (fdb_kvs_handle *)0x118435;
        fdb_close((fdb_file_handle *)phStack_17d0);
        pfStack_1818 = (fdb_kvs_handle *)0x11843f;
        fdb_close((fdb_file_handle *)phStack_17d8);
        pfStack_1818 = (fdb_kvs_handle *)0x118449;
        fdb_close((fdb_file_handle *)pkStack_17e0);
        pfStack_1818 = (fdb_kvs_handle *)0x11844e;
        fdb_shutdown();
        pfStack_1818 = (fdb_kvs_handle *)0x118453;
        memleak_end();
        pcVar12 = "%s PASSED\n";
        if (transaction_simple_api_test()::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pfStack_1818 = (fdb_kvs_handle *)0x118484;
        fprintf(_stderr,pcVar12,"transaction simple API test");
        return;
      }
    }
LAB_00118507:
    config_00 = (fdb_kvs_config *)(auStack_17a0 + 0x100);
    pcVar22 = auStack_17a0;
    pfStack_1818 = (fdb_kvs_handle *)0x11850c;
    transaction_simple_api_test();
  }
  pfStack_1818 = (fdb_kvs_handle *)in_memory_snapshot_thread;
  transaction_simple_api_test();
  pfStack_1840 = pfVar18;
  pfStack_1838 = (fdb_kvs_handle *)pcVar22;
  pfStack_1830 = handle;
  pfStack_1828 = config_00;
  pfStack_1820 = pfVar17;
  pfStack_1818 = doc_00;
  gettimeofday(&tStack_1a58,(__timezone_ptr_t)0x0);
  fVar3 = fdb_snapshot_open(pfVar9,&pfStack_1a60,0xffffffffffffffff);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar3 = fdb_iterator_init(pfStack_1a60,&pfStack_1a70,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar15 = 0;
  do {
    uVar10 = (uint)uVar15;
    pfStack_1a68 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_get(pfStack_1a70,&pfStack_1a68);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    sprintf(acStack_1948,"key%d",uVar15);
    sprintf(acStack_1a48,"body%d",uVar15);
    pfVar8 = pfStack_1a68;
    pvVar21 = pfStack_1a68->key;
    iVar4 = bcmp(pvVar21,acStack_1948,pfStack_1a68->keylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_1948,pvVar21,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar21 = pfVar8->body;
    iVar4 = bcmp(pvVar21,acStack_1a48,pfVar8->bodylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_1a48,pvVar21,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar10 = uVar10 + 1;
    uVar15 = (ulong)uVar10;
    fdb_doc_free(pfVar8);
    fVar3 = fdb_iterator_next(pfStack_1a70);
  } while (fVar3 == FDB_RESULT_SUCCESS);
  if (uVar10 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar3 = fdb_iterator_close(pfStack_1a70);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdcc);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdcc,"void *in_memory_snapshot_thread(void *)");
  }
  fVar3 = fdb_kvs_close(pfStack_1a60);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  pthread_exit((void *)0x0);
}

Assistant:

void rollback_forward_seqnum()
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, n=100;
    int rb1_seqnum, rb2_seqnum;
    char keybuf[256];
    char setop[3];
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1, *mirror_kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n+1);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = n;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 5;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &mirror_kv1, NULL, &kvs_config);


    // set n docs within both dbs
    for(i=0;i<=n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, NULL, 0);
        fdb_set(kv1, doc[i]);
        fdb_set_kv(mirror_kv1, keybuf, strlen(keybuf), setop, 3);
    } // last set should have caused a wal flush

    fdb_del(kv1, doc[n]);

    // commit and save seqnum1
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_get_kvs_info(kv1, &info);
    rb1_seqnum = info.last_seqnum;

    // delete all docs in kv1
    for(i=0;i<n;++i){
        fdb_del(kv1, doc[i]);
    }

    // commit and save seqnum2
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_get_kvs_info(kv1, &info);
    rb2_seqnum = info.last_seqnum;

    // sets again
    for(i=0;i<n;++i){
        doc[i]->deleted = false;
        fdb_set(kv1, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // rollback to first seqnum
    status = fdb_rollback(&kv1, rb1_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.deleted_count == 1);

    // rollback to second seqnum
    status = fdb_rollback(&kv1, rb2_seqnum);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_iterator_sequence_init(mirror_kv1, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (rdoc->seqnum != (uint64_t)n+1) {
            status = fdb_get_metaonly_byseq(kv1, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(rdoc->deleted == false);
        } else {
            status = fdb_get_metaonly(kv1, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(rdoc->deleted == true);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    for (i=0;i<=n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_iterator_close(it);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("rollback forward seqnum");
}